

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interpreter.c
# Opt level: O2

void configure_embed_libc(void)

{
  char *value;
  
  value = apprun_shell_expand_variables
                    ("$APPDIR_LIBRARY_PATH:$APPDIR_LIBC_LIBRARY_PATH:$APPRUN_ORIGINAL_LD_LIBRARY_PATH"
                     ,(char **)0x0);
  apprun_env_set("LD_LIBRARY_PATH",value,"",value);
  free(value);
  return;
}

Assistant:

void configure_embed_libc() {
#ifdef DEBUG
    fprintf(stderr, "APPRUN_DEBUG: using appdir libc\n");
#endif
    char *ld_library_path = apprun_shell_expand_variables("$"APPDIR_LIBRARY_PATH_ENV":"
                                                          "$"APPDIR_LIBC_LIBRARY_PATH_ENV":"
                                                          "$"APPRUN_ENV_ORIG_PREFIX"LD_LIBRARY_PATH", NULL);

    apprun_env_set("LD_LIBRARY_PATH", ld_library_path, "", ld_library_path);
    free(ld_library_path);
}